

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_tableref.cpp
# Opt level: O0

unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>
duckdb::TableFunctionRef::Deserialize(Deserializer *deserializer)

{
  char *tag;
  pointer pTVar1;
  unique_ptr<duckdb::TableFunctionRef,_std::default_delete<duckdb::TableFunctionRef>_> *in_RSI;
  Deserializer *in_RDI;
  unique_ptr<duckdb::TableFunctionRef,_std::default_delete<duckdb::TableFunctionRef>,_true> result;
  pointer in_stack_ffffffffffffff98;
  TableFunctionRef *in_stack_ffffffffffffffa0;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> *ret;
  unique_ptr<duckdb::TableFunctionRef,_std::default_delete<duckdb::TableFunctionRef>_> *tag_00;
  _Head_base<0UL,_duckdb::TableRef_*,_false> ret_00;
  field_id_t in_stack_ffffffffffffffde;
  Deserializer *in_stack_ffffffffffffffe0;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> local_18
  ;
  unique_ptr<duckdb::TableFunctionRef,_std::default_delete<duckdb::TableFunctionRef>_> *local_10;
  
  ret_00._M_head_impl = (TableRef *)in_RDI;
  local_10 = in_RSI;
  tag = (char *)operator_new(0x78);
  TableFunctionRef(in_stack_ffffffffffffffa0);
  ret = &local_18;
  unique_ptr<duckdb::TableFunctionRef,std::default_delete<duckdb::TableFunctionRef>,true>::
  unique_ptr<std::default_delete<duckdb::TableFunctionRef>,void>
            ((unique_ptr<duckdb::TableFunctionRef,_std::default_delete<duckdb::TableFunctionRef>,_true>
              *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  tag_00 = local_10;
  pTVar1 = unique_ptr<duckdb::TableFunctionRef,_std::default_delete<duckdb::TableFunctionRef>,_true>
           ::operator->((unique_ptr<duckdb::TableFunctionRef,_std::default_delete<duckdb::TableFunctionRef>,_true>
                         *)in_stack_ffffffffffffffa0);
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            (in_RDI,(field_id_t)((ulong)pTVar1 >> 0x30),(char *)tag_00,ret);
  pTVar1 = unique_ptr<duckdb::TableFunctionRef,_std::default_delete<duckdb::TableFunctionRef>,_true>
           ::operator->((unique_ptr<duckdb::TableFunctionRef,_std::default_delete<duckdb::TableFunctionRef>,_true>
                         *)in_stack_ffffffffffffffa0);
  Deserializer::ReadPropertyWithDefault<duckdb::vector<std::__cxx11::string,true>>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffde,tag,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              *)ret_00._M_head_impl);
  unique_ptr<duckdb::TableRef,std::default_delete<duckdb::TableRef>,true>::
  unique_ptr<duckdb::TableFunctionRef,std::default_delete<std::unique_ptr<duckdb::TableRef,std::default_delete<duckdb::TableRef>>>,void>
            ((unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> *)pTVar1,
             local_10);
  unique_ptr<duckdb::TableFunctionRef,_std::default_delete<duckdb::TableFunctionRef>,_true>::
  ~unique_ptr((unique_ptr<duckdb::TableFunctionRef,_std::default_delete<duckdb::TableFunctionRef>,_true>
               *)0xae995a);
  return (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)
         (_Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>)
         ret_00._M_head_impl;
}

Assistant:

unique_ptr<TableRef> TableFunctionRef::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<TableFunctionRef>(new TableFunctionRef());
	deserializer.ReadPropertyWithDefault<unique_ptr<ParsedExpression>>(200, "function", result->function);
	deserializer.ReadPropertyWithDefault<vector<string>>(201, "column_name_alias", result->column_name_alias);
	return std::move(result);
}